

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,pointer pos,
          ProdItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  undefined8 uVar3;
  RandSeqProductionSymbol *pRVar4;
  size_t sVar5;
  ProdBase PVar6;
  undefined4 uVar7;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  long lVar11;
  long lVar12;
  size_type sVar13;
  ulong uVar14;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar2 = this->cap;
  if (uVar14 < uVar2 * 2) {
    uVar14 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pPVar8 = (pointer)operator_new(uVar14 << 5);
  uVar3 = *(undefined8 *)args;
  pRVar4 = args->target;
  sVar5 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar8 + lVar12 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar5;
  *(undefined8 *)((long)pPVar8 + lVar12) = uVar3;
  ((undefined8 *)((long)pPVar8 + lVar12))[1] = pRVar4;
  p = this->data_;
  sVar13 = this->len;
  lVar11 = (long)p + (sVar13 * 0x20 - (long)pos);
  pPVar9 = p;
  pPVar10 = pPVar8;
  if (lVar11 == 0) {
    pPVar9 = pPVar8;
    pPVar10 = p;
    if (sVar13 != 0) {
      do {
        PVar6.kind = (pPVar10->super_ProdBase).kind;
        uVar7 = *(undefined4 *)&pPVar10->field_0x4;
        pRVar4 = pPVar10->target;
        sVar5 = (pPVar10->args)._M_extent._M_extent_value;
        (pPVar9->args)._M_ptr = (pPVar10->args)._M_ptr;
        (pPVar9->args)._M_extent._M_extent_value = sVar5;
        pPVar9->super_ProdBase = (ProdBase)PVar6.kind;
        *(undefined4 *)&pPVar9->field_0x4 = uVar7;
        pPVar9->target = pRVar4;
        pPVar10 = pPVar10 + 1;
        pPVar9 = pPVar9 + 1;
      } while (pPVar10 != pos);
    }
  }
  else {
    for (; pPVar9 != pos; pPVar9 = pPVar9 + 1) {
      PVar6.kind = (pPVar9->super_ProdBase).kind;
      uVar7 = *(undefined4 *)&pPVar9->field_0x4;
      pRVar4 = pPVar9->target;
      sVar5 = (pPVar9->args)._M_extent._M_extent_value;
      (pPVar10->args)._M_ptr = (pPVar9->args)._M_ptr;
      (pPVar10->args)._M_extent._M_extent_value = sVar5;
      pPVar10->super_ProdBase = (ProdBase)PVar6.kind;
      *(undefined4 *)&pPVar10->field_0x4 = uVar7;
      pPVar10->target = pRVar4;
      pPVar10 = pPVar10 + 1;
    }
    memcpy((void *)((long)pPVar8 + lVar12 + 0x20),pos,(lVar11 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar13 = this->len;
  }
  this->len = sVar13 + 1;
  this->cap = uVar14;
  this->data_ = pPVar8;
  return (pointer)((long)pPVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}